

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::ExpandNoLoad
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  Mutex *pMVar1;
  RefcountedTemplate *this_00;
  bool bVar2;
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  *c;
  second_type *psVar3;
  ostream *poVar4;
  TemplateDictionaryInterface *pTVar5;
  pair<unsigned_long,_int> v;
  
  pTVar5 = dict;
  c = (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
       *)TemplateString::GetGlobalId(filename);
  pMVar1 = this->mutex_;
  Mutex::ReaderLock(pMVar1);
  if (this->is_frozen_ == false) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"DFATAL: ");
    std::operator<<(poVar4,": ExpandNoLoad() only works on frozen caches.");
  }
  else {
    v.first = (ulong)strip;
    v._8_8_ = pTVar5;
    psVar3 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                       ((ctemplate *)this->parsed_template_cache_,c,v);
    if (psVar3 != (second_type *)0x0) {
      this_00 = psVar3->refcounted_tpl;
      RefcountedTemplate::IncRef(this_00);
      Mutex::ReaderUnlock(pMVar1);
      bVar2 = Template::ExpandWithDataAndCache
                        (this_00->ptr_,expand_emitter,dict,per_expand_data,this);
      pMVar1 = this->mutex_;
      Mutex::Lock(pMVar1);
      RefcountedTemplate::DecRef(this_00);
      Mutex::Unlock(pMVar1);
      return bVar2;
    }
  }
  Mutex::ReaderUnlock(pMVar1);
  return false;
}

Assistant:

bool TemplateCache::ExpandNoLoad(
    const TemplateString& filename,
    Strip strip,
    const TemplateDictionaryInterface *dict,
    PerExpandData *per_expand_data,
    ExpandEmitter *expand_emitter) const {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  CachedTemplate cached_tpl;
  {
    ReaderMutexLock ml(mutex_);
    if (!is_frozen_) {
      LOG(DFATAL) << ": ExpandNoLoad() only works on frozen caches.";
      return false;
    }
    CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
    if (!it) {
      return false;
    }
    cached_tpl = *it;
    cached_tpl.refcounted_tpl->IncRef();
  }
  const bool result = cached_tpl.refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    cached_tpl.refcounted_tpl->DecRef();
  }
  return result;
}